

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_7zip.c
# Opt level: O0

int slurp_central_directory(archive_read *a,_7zip *zip,_7z_header_info *header)

{
  int iVar1;
  uint32_t uVar2;
  uLong uVar3;
  int64_t iVar4;
  int *piVar5;
  bool bVar6;
  int local_58;
  int r;
  int check_header_crc;
  ssize_t bytes_avail;
  uchar *puStack_40;
  uint32_t next_header_crc;
  uint64_t next_header_size;
  uint64_t next_header_offset;
  uchar *p;
  _7z_header_info *header_local;
  _7zip *zip_local;
  archive_read *a_local;
  
  p = (uchar *)header;
  header_local = (_7z_header_info *)zip;
  zip_local = (_7zip *)a;
  next_header_offset = (uint64_t)__archive_read_ahead(a,0x20,(ssize_t *)&r);
  if ((int *)next_header_offset == (int *)0x0) {
    return -0x1e;
  }
  if ((((char)*(int *)next_header_offset == 'M') && (*(char *)(next_header_offset + 1) == 'Z')) ||
     (*(int *)next_header_offset == 0x464c457f)) {
    iVar1 = skip_sfx((archive_read *)zip_local,_r);
    if (iVar1 < -0x14) {
      return iVar1;
    }
    next_header_offset =
         (uint64_t)__archive_read_ahead((archive_read *)zip_local,0x20,(ssize_t *)&r);
    if ((void *)next_header_offset == (void *)0x0) {
      return -0x1e;
    }
  }
  header_local[3].emptyFileBools = header_local[3].emptyFileBools + 0x20;
  iVar1 = memcmp((void *)next_header_offset,anon_var_dwarf_6d9c25,6);
  if (iVar1 == 0) {
    uVar3 = cm_zlib_crc32(0,(uchar *)(next_header_offset + 0xc),0x14);
    uVar2 = archive_le32dec((void *)(next_header_offset + 8));
    if (uVar3 == uVar2) {
      next_header_size = archive_le64dec((void *)(next_header_offset + 0xc));
      puStack_40 = (uchar *)archive_le64dec((void *)(next_header_offset + 0x14));
      bytes_avail._4_4_ = archive_le32dec((void *)(next_header_offset + 0x1c));
      if (puStack_40 == (uchar *)0x0) {
        a_local._4_4_ = 1;
      }
      else if ((long)next_header_size < 0) {
        archive_set_error((archive *)zip_local,-1,"Malformed 7-Zip archive");
        a_local._4_4_ = -0x1e;
      }
      else {
        __archive_read_consume((archive_read *)zip_local,0x20);
        if (next_header_size != 0) {
          if (_r < (long)next_header_size) {
            iVar4 = __archive_read_seek((archive_read *)zip_local,
                                        (int64_t)(header_local[3].emptyFileBools + next_header_size)
                                        ,0);
            if (iVar4 < 0) {
              return -0x1e;
            }
          }
          else {
            __archive_read_consume((archive_read *)zip_local,next_header_size);
          }
        }
        header_local[6].emptyStreamBools = (uchar *)next_header_size;
        header_local[3].emptyStreamBools = (uchar *)next_header_size;
        header_local[2].attrBools = puStack_40;
        header_local[3].dataIndex = 0;
        *(undefined4 *)((long)&header_local[2].antiBools + 4) = 0;
        *(undefined4 *)&header_local[2].antiBools = 1;
        *(undefined4 *)&header_local[0x206].emptyStreamBools = 0;
        bVar6 = true;
        next_header_offset = (uint64_t)header_bytes((archive_read *)zip_local,1);
        if ((byte *)next_header_offset == (byte *)0x0) {
          archive_set_error((archive *)zip_local,0x54,"Truncated 7-Zip file body");
          a_local._4_4_ = -0x1e;
        }
        else {
          if (*(byte *)next_header_offset != 1) {
            if (*(byte *)next_header_offset != 0x17) {
              archive_set_error((archive *)zip_local,-1,"Unexpected Property ID = %X",
                                (ulong)*(byte *)next_header_offset);
              return -0x1e;
            }
            local_58 = decode_encoded_header_info
                                 ((archive_read *)zip_local,(_7z_stream_info *)header_local);
            if ((local_58 == 0) && (header_local[3].dataIndex != (ulong)bytes_avail._4_4_)) {
              archive_set_error((archive *)zip_local,-1,"Damaged 7-Zip archive");
              local_58 = -1;
            }
            if (local_58 == 0) {
              bVar6 = header_local[1].emptyFileBools[0x48] != '\0';
              if (bVar6) {
                bytes_avail._4_4_ = *(uint32_t *)(header_local[1].emptyFileBools + 0x4c);
              }
              if (header_local[7].emptyStreamBools != (uchar *)0x0) {
                read_consume((archive_read *)zip_local);
              }
              local_58 = setup_decode_folder((archive_read *)zip_local,
                                             (_7z_folder *)header_local[1].emptyFileBools,1);
              if (local_58 == 0) {
                header_local[2].attrBools = header_local[6].antiBools;
                local_58 = seek_pack((archive_read *)zip_local);
              }
            }
            free_StreamsInfo((_7z_stream_info *)header_local);
            memset(header_local,0,0x68);
            if (local_58 < 0) {
              return -0x1e;
            }
            *(undefined4 *)((long)&header_local[2].antiBools + 4) = 1;
            header_local[3].dataIndex = 0;
          }
          piVar5 = __errno_location();
          *piVar5 = 0;
          iVar1 = read_Header((archive_read *)zip_local,(_7z_header_info *)p,
                              *(int *)((long)&header_local[2].antiBools + 4));
          if (iVar1 < 0) {
            piVar5 = __errno_location();
            if (*piVar5 == 0xc) {
              archive_set_error((archive *)zip_local,-1,"Couldn\'t allocate memory");
            }
            else {
              archive_set_error((archive *)zip_local,-1,"Damaged 7-Zip archive");
            }
            a_local._4_4_ = -0x1e;
          }
          else {
            next_header_offset = (uint64_t)header_bytes((archive_read *)zip_local,1);
            if (((uchar *)next_header_offset == (uchar *)0x0) ||
               (*(uchar *)next_header_offset != '\0')) {
              archive_set_error((archive *)zip_local,-1,"Malformed 7-Zip archive");
              a_local._4_4_ = -0x1e;
            }
            else if ((bVar6) && (header_local[3].dataIndex != (ulong)bytes_avail._4_4_)) {
              archive_set_error((archive *)zip_local,-1,"Malformed 7-Zip archive");
              a_local._4_4_ = -0x1e;
            }
            else {
              *(undefined4 *)((long)&header_local[6].attrBools + 4) = 0;
              *(undefined4 *)&header_local[6].attrBools = 0;
              header_local[6].antiBools = (uchar *)0x0;
              header_local[6].dataIndex = 0;
              header_local[7].emptyStreamBools = (uchar *)0x0;
              *(undefined4 *)&header_local[2].antiBools = 0;
              a_local._4_4_ = 0;
            }
          }
        }
      }
    }
    else {
      archive_set_error((archive *)zip_local,-1,"Header CRC error");
      a_local._4_4_ = -0x1e;
    }
  }
  else {
    archive_set_error((archive *)zip_local,-1,"Not 7-Zip archive file");
    a_local._4_4_ = -0x1e;
  }
  return a_local._4_4_;
}

Assistant:

static int
slurp_central_directory(struct archive_read *a, struct _7zip *zip,
    struct _7z_header_info *header)
{
	const unsigned char *p;
	uint64_t next_header_offset;
	uint64_t next_header_size;
	uint32_t next_header_crc;
	ssize_t bytes_avail;
	int check_header_crc, r;

	if ((p = __archive_read_ahead(a, 32, &bytes_avail)) == NULL)
		return (ARCHIVE_FATAL);

	if ((p[0] == 'M' && p[1] == 'Z') || memcmp(p, "\x7F\x45LF", 4) == 0) {
		/* This is an executable ? Must be self-extracting... */
		r = skip_sfx(a, bytes_avail);
		if (r < ARCHIVE_WARN)
			return (r);
		if ((p = __archive_read_ahead(a, 32, &bytes_avail)) == NULL)
			return (ARCHIVE_FATAL);
	}
	zip->seek_base += 32;

	if (memcmp(p, _7ZIP_SIGNATURE, 6) != 0) {
		archive_set_error(&a->archive, -1, "Not 7-Zip archive file");
		return (ARCHIVE_FATAL);
	}

	/* CRC check. */
	if (crc32(0, (const unsigned char *)p + 12, 20)
	    != archive_le32dec(p + 8)) {
		archive_set_error(&a->archive, -1, "Header CRC error");
		return (ARCHIVE_FATAL);
	}

	next_header_offset = archive_le64dec(p + 12);
	next_header_size = archive_le64dec(p + 20);
	next_header_crc = archive_le32dec(p + 28);

	if (next_header_size == 0)
		/* There is no entry in an archive file. */
		return (ARCHIVE_EOF);

	if (((int64_t)next_header_offset) < 0) {
		archive_set_error(&a->archive, -1, "Malformed 7-Zip archive");
		return (ARCHIVE_FATAL);
	}
	__archive_read_consume(a, 32);
	if (next_header_offset != 0) {
		if (bytes_avail >= (ssize_t)next_header_offset)
			__archive_read_consume(a, next_header_offset);
		else if (__archive_read_seek(a,
		    next_header_offset + zip->seek_base, SEEK_SET) < 0)
			return (ARCHIVE_FATAL);
	}
	zip->stream_offset = next_header_offset;
	zip->header_offset = next_header_offset;
	zip->header_bytes_remaining = next_header_size;
	zip->header_crc32 = 0;
	zip->header_is_encoded = 0;
	zip->header_is_being_read = 1;
	zip->has_encrypted_entries = 0;
	check_header_crc = 1;

	if ((p = header_bytes(a, 1)) == NULL) {
		archive_set_error(&a->archive,
		    ARCHIVE_ERRNO_FILE_FORMAT,
		    "Truncated 7-Zip file body");
		return (ARCHIVE_FATAL);
	}
	/* Parse ArchiveProperties. */
	switch (p[0]) {
	case kEncodedHeader:
		/*
		 * The archive has an encoded header and we have to decode it
		 * in order to parse the header correctly.
		 */
		r = decode_encoded_header_info(a, &(zip->si));

		/* Check the EncodedHeader CRC.*/
		if (r == 0 && zip->header_crc32 != next_header_crc) {
			archive_set_error(&a->archive, -1,
			    "Damaged 7-Zip archive");
			r = -1;
		}
		if (r == 0) {
			if (zip->si.ci.folders[0].digest_defined)
				next_header_crc = zip->si.ci.folders[0].digest;
			else
				check_header_crc = 0;
			if (zip->pack_stream_bytes_unconsumed)
				read_consume(a);
			r = setup_decode_folder(a, zip->si.ci.folders, 1);
			if (r == 0) {
				zip->header_bytes_remaining =
					zip->folder_outbytes_remaining;
				r = seek_pack(a);
			}
		}
		/* Clean up StreamsInfo. */
		free_StreamsInfo(&(zip->si));
		memset(&(zip->si), 0, sizeof(zip->si));
		if (r < 0)
			return (ARCHIVE_FATAL);
		zip->header_is_encoded = 1;
		zip->header_crc32 = 0;
		/* FALL THROUGH */
	case kHeader:
		/*
		 * Parse the header.
		 */
		errno = 0;
		r = read_Header(a, header, zip->header_is_encoded);
		if (r < 0) {
			if (errno == ENOMEM)
				archive_set_error(&a->archive, -1,
				    "Couldn't allocate memory");
			else
				archive_set_error(&a->archive, -1,
				    "Damaged 7-Zip archive");
			return (ARCHIVE_FATAL);
		}

		/*
		 *  Must be kEnd.
		 */
		if ((p = header_bytes(a, 1)) == NULL ||*p != kEnd) {
			archive_set_error(&a->archive, -1,
			    "Malformed 7-Zip archive");
			return (ARCHIVE_FATAL);
		}

		/* Check the Header CRC.*/
		if (check_header_crc && zip->header_crc32 != next_header_crc) {
			archive_set_error(&a->archive, -1,
			    "Malformed 7-Zip archive");
			return (ARCHIVE_FATAL);
		}
		break;
	default:
		archive_set_error(&a->archive, -1,
		    "Unexpected Property ID = %X", p[0]);
		return (ARCHIVE_FATAL);
	}

	/* Clean up variables be used for decoding the archive header */
	zip->pack_stream_remaining = 0;
	zip->pack_stream_index = 0;
	zip->folder_outbytes_remaining = 0;
	zip->uncompressed_buffer_bytes_remaining = 0;
	zip->pack_stream_bytes_unconsumed = 0;
	zip->header_is_being_read = 0;

	return (ARCHIVE_OK);
}